

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WindowAttach(Parse *pParse,Expr *p,Window *pWin)

{
  uint uVar1;
  
  if (p == (Expr *)0x0) {
    sqlite3WindowDelete(pParse->db,pWin);
    return;
  }
  if (pWin != (Window *)0x0) {
    (p->y).pWin = pWin;
    uVar1 = p->flags;
    p->flags = uVar1 | 0x1000000;
    pWin->pOwner = p;
    if ((uVar1 & 2) != 0) {
      sqlite3ErrorMsg(pParse,"DISTINCT is not supported for window functions");
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WindowAttach(Parse *pParse, Expr *p, Window *pWin){
  if( p ){
    assert( p->op==TK_FUNCTION );
    /* This routine is only called for the parser.  If pWin was not
    ** allocated due to an OOM, then the parser would fail before ever
    ** invoking this routine */
    if( ALWAYS(pWin) ){
      p->y.pWin = pWin;
      ExprSetProperty(p, EP_WinFunc);
      pWin->pOwner = p;
      if( p->flags & EP_Distinct ){
        sqlite3ErrorMsg(pParse,
           "DISTINCT is not supported for window functions");
      }
    }
  }else{
    sqlite3WindowDelete(pParse->db, pWin);
  }
}